

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::InstDebugPrintfPass::GenDebugStreamWrite
          (InstDebugPrintfPass *this,uint32_t shader_id,uint32_t instruction_idx_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *validation_ids,
          InstructionBuilder *builder)

{
  pointer puVar1;
  pointer puVar2;
  uint32_t result_type;
  uint32_t function;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args;
  undefined8 *local_48;
  undefined8 *puStack_40;
  undefined8 *local_38;
  
  puVar1 = (validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  puVar2 = (validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  local_38 = (undefined8 *)0x0;
  local_48 = (undefined8 *)operator_new(8);
  puStack_40 = local_48 + 1;
  *local_48 = CONCAT44(instruction_idx_id,shader_id);
  local_38 = puStack_40;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,puStack_40,
             (validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (validation_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  result_type = InstrumentPass::GetVoidId(&this->super_InstrumentPass);
  function = GetStreamWriteFunctionId(this,(uint32_t)((ulong)((long)puVar1 - (long)puVar2) >> 2));
  InstructionBuilder::AddFunctionCall
            (builder,result_type,function,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void InstDebugPrintfPass::GenDebugStreamWrite(
    uint32_t shader_id, uint32_t instruction_idx_id,
    const std::vector<uint32_t>& validation_ids, InstructionBuilder* builder) {
  // Call debug output function. Pass func_idx, instruction_idx and
  // validation ids as args.
  uint32_t val_id_cnt = static_cast<uint32_t>(validation_ids.size());
  std::vector<uint32_t> args = {shader_id, instruction_idx_id};
  (void)args.insert(args.end(), validation_ids.begin(), validation_ids.end());
  (void)builder->AddFunctionCall(GetVoidId(),
                                 GetStreamWriteFunctionId(val_id_cnt), args);
}